

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::TuplePrefixPrinter<3ul>::
     PrintPrefixTo<std::tuple<int,int,char_const*,int,int,double>>
               (tuple<int,_int,_const_char_*,_int,_int,_double> *t,ostream *os)

{
  type *value;
  ostream *os_local;
  tuple<int,_int,_const_char_*,_int,_int,_double> *t_local;
  
  TuplePrefixPrinter<2ul>::PrintPrefixTo<std::tuple<int,int,char_const*,int,int,double>>(t,os);
  std::operator<<(os,", ");
  value = TuplePolicy<std::tuple<int,int,char_const*,int,int,double>>::get<2ul>(t);
  UniversalPrinter<const_char_*>::Print(value,os);
  return;
}

Assistant:

static void PrintPrefixTo(const Tuple& t, ::std::ostream* os) {
    TuplePrefixPrinter<N - 1>::PrintPrefixTo(t, os);
    GTEST_INTENTIONAL_CONST_COND_PUSH_()
    if (N > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
      *os << ", ";
    }
    UniversalPrinter<
        typename TuplePolicy<Tuple>::template tuple_element<N - 1>::type>
        ::Print(TuplePolicy<Tuple>::template get<N - 1>(t), os);
  }